

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode pubkey_pem_to_der(char *pem,uchar **der,size_t *der_len)

{
  CURLcode CVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  dynbuf pbuf;
  dynbuf local_50;
  
  CVar1 = CURLE_BAD_CONTENT_ENCODING;
  if (pem != (char *)0x0) {
    Curl_dyn_init(&local_50,0x100000);
    pcVar2 = strstr(pem,"-----BEGIN PUBLIC KEY-----");
    if ((pcVar2 != (char *)0x0) &&
       (((lVar4 = (long)pcVar2 - (long)pem, lVar4 == 0 || (pem[lVar4 + -1] == '\n')) &&
        (pcVar3 = strstr(pem + lVar4 + 0x1a,"\n-----END PUBLIC KEY-----"), pcVar3 != (char *)0x0))))
    {
      if (lVar4 + 0x1aU < (ulong)((long)pcVar3 - (long)pem)) {
        pcVar3 = pcVar3 + (-0x1a - (long)pcVar2);
        pcVar2 = pem + lVar4 + 0x1aU;
        do {
          if (((*pcVar2 != '\n') && (*pcVar2 != '\r')) &&
             (CVar1 = Curl_dyn_addn(&local_50,pcVar2,1), CVar1 != CURLE_OK)) {
            return CVar1;
          }
          pcVar2 = pcVar2 + 1;
          pcVar3 = pcVar3 + -1;
        } while (pcVar3 != (char *)0x0);
      }
      pcVar2 = Curl_dyn_ptr(&local_50);
      CVar1 = Curl_base64_decode(pcVar2,der,der_len);
      Curl_dyn_free(&local_50);
    }
  }
  return CVar1;
}

Assistant:

static CURLcode pubkey_pem_to_der(const char *pem,
                                  unsigned char **der, size_t *der_len)
{
  char *begin_pos, *end_pos;
  size_t pem_count, pem_len;
  CURLcode result;
  struct dynbuf pbuf;

  /* if no pem, exit. */
  if(!pem)
    return CURLE_BAD_CONTENT_ENCODING;

  Curl_dyn_init(&pbuf, MAX_PINNED_PUBKEY_SIZE);

  begin_pos = strstr(pem, "-----BEGIN PUBLIC KEY-----");
  if(!begin_pos)
    return CURLE_BAD_CONTENT_ENCODING;

  pem_count = begin_pos - pem;
  /* Invalid if not at beginning AND not directly following \n */
  if(0 != pem_count && '\n' != pem[pem_count - 1])
    return CURLE_BAD_CONTENT_ENCODING;

  /* 26 is length of "-----BEGIN PUBLIC KEY-----" */
  pem_count += 26;

  /* Invalid if not directly following \n */
  end_pos = strstr(pem + pem_count, "\n-----END PUBLIC KEY-----");
  if(!end_pos)
    return CURLE_BAD_CONTENT_ENCODING;

  pem_len = end_pos - pem;

  /*
   * Here we loop through the pem array one character at a time between the
   * correct indices, and place each character that is not '\n' or '\r'
   * into the stripped_pem array, which should represent the raw base64 string
   */
  while(pem_count < pem_len) {
    if('\n' != pem[pem_count] && '\r' != pem[pem_count]) {
      result = Curl_dyn_addn(&pbuf, &pem[pem_count], 1);
      if(result)
        return result;
    }
    ++pem_count;
  }

  result = Curl_base64_decode(Curl_dyn_ptr(&pbuf), der, der_len);

  Curl_dyn_free(&pbuf);

  return result;
}